

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLinearSumBounds.cpp
# Opt level: O0

void __thiscall
HighsLinearSumBounds::updatedImplVarUpper
          (HighsLinearSumBounds *this,HighsInt sum,HighsInt var,double coefficient,
          double oldImplVarUpper,HighsInt oldImplVarUpperSource)

{
  double *pdVar1;
  reference pvVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  double in_XMM0_Qa;
  HighsCDouble *this_00;
  double vUpper;
  double oldVUpper;
  double in_stack_ffffffffffffff88;
  HighsCDouble *in_stack_ffffffffffffff90;
  double in_stack_ffffffffffffff98;
  HighsCDouble *in_stack_ffffffffffffffa0;
  double local_50;
  double local_48;
  double local_20;
  double local_18;
  int local_10;
  int local_c;
  
  local_18 = in_XMM0_Qa;
  local_10 = in_EDX;
  local_c = in_ESI;
  if (in_ECX == in_ESI) {
    local_48 = *(double *)(*(long *)(in_RDI + 200) + (long)in_EDX * 8);
  }
  else {
    pdVar1 = std::min<double>(&local_20,(double *)(*(long *)(in_RDI + 200) + (long)in_EDX * 8));
    local_48 = *pdVar1;
  }
  if (*(int *)(*(long *)(in_RDI + 0xe8) + (long)local_10 * 4) == local_c) {
    local_50 = *(double *)(*(long *)(in_RDI + 200) + (long)local_10 * 8);
  }
  else {
    pdVar1 = std::min<double>((double *)(*(long *)(in_RDI + 0xd8) + (long)local_10 * 8),
                              (double *)(*(long *)(in_RDI + 200) + (long)local_10 * 8));
    local_50 = *pdVar1;
  }
  if ((local_50 != local_48) || (NAN(local_50) || NAN(local_48))) {
    if (local_18 <= 0.0) {
      if ((local_48 != INFINITY) || (NAN(local_48))) {
        in_stack_ffffffffffffff98 = local_48 * local_18;
        std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                  ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 0x60),
                   (long)local_c);
        HighsCDouble::operator-=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
      else {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x90),(long)local_c);
        *pvVar2 = *pvVar2 + -1;
      }
      if ((local_50 != INFINITY) || (NAN(local_50))) {
        std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                  ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 0x60),
                   (long)local_c);
        HighsCDouble::operator+=(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      }
      else {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x90),(long)local_c);
        *pvVar2 = *pvVar2 + 1;
      }
    }
    else {
      if ((local_48 != INFINITY) || (NAN(local_48))) {
        std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                  ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 0x78),
                   (long)local_c);
        HighsCDouble::operator-=(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
      }
      else {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xa8),(long)local_c);
        *pvVar2 = *pvVar2 + -1;
      }
      if ((local_50 != INFINITY) || (NAN(local_50))) {
        this_00 = (HighsCDouble *)(local_50 * local_18);
        std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                  ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(in_RDI + 0x78),
                   (long)local_c);
        HighsCDouble::operator+=(this_00,in_stack_ffffffffffffff98);
      }
      else {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xa8),(long)local_c);
        *pvVar2 = *pvVar2 + 1;
      }
    }
  }
  return;
}

Assistant:

void HighsLinearSumBounds::updatedImplVarUpper(HighsInt sum, HighsInt var,
                                               double coefficient,
                                               double oldImplVarUpper,
                                               HighsInt oldImplVarUpperSource) {
  double oldVUpper = oldImplVarUpperSource == sum
                         ? varUpper[var]
                         : std::min(oldImplVarUpper, varUpper[var]);

  double vUpper = implVarUpperSource[var] == sum
                      ? varUpper[var]
                      : std::min(implVarUpper[var], varUpper[var]);

  if (vUpper == oldVUpper) return;

  if (coefficient > 0) {
    if (oldVUpper == kHighsInf)
      numInfSumUpper[sum] -= 1;
    else
      sumUpper[sum] -= oldVUpper * coefficient;

    if (vUpper == kHighsInf)
      numInfSumUpper[sum] += 1;
    else
      sumUpper[sum] += vUpper * coefficient;
  } else {
    if (oldVUpper == kHighsInf)
      numInfSumLower[sum] -= 1;
    else
      sumLower[sum] -= oldVUpper * coefficient;

    if (vUpper == kHighsInf)
      numInfSumLower[sum] += 1;
    else
      sumLower[sum] += vUpper * coefficient;
  }
}